

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O0

filepos_t __thiscall
libebml::EbmlElement::OverwriteHead(EbmlElement *this,IOCallback *output,bool bKeepPosition)

{
  int iVar1;
  undefined4 extraout_var;
  uint64 uVar2;
  filepos_t Result;
  uint64 CurrentPosition;
  bool bKeepPosition_local;
  IOCallback *output_local;
  EbmlElement *this_local;
  
  if (this->ElementPosition == 0) {
    this_local = (EbmlElement *)0x0;
  }
  else {
    iVar1 = (*output->_vptr_IOCallback[5])();
    uVar2 = GetElementPosition(this);
    (*output->_vptr_IOCallback[3])(output,uVar2,0);
    this_local = (EbmlElement *)MakeRenderHead(this,output,bKeepPosition);
    (*output->_vptr_IOCallback[3])(output,CONCAT44(extraout_var,iVar1),0);
  }
  return (filepos_t)this_local;
}

Assistant:

filepos_t EbmlElement::OverwriteHead(IOCallback & output, bool bKeepPosition)
{
  if (ElementPosition == 0) {
    return 0; // the element has not been written
  }

  uint64 CurrentPosition = output.getFilePointer();
  output.setFilePointer(GetElementPosition());
  filepos_t Result = MakeRenderHead(output, bKeepPosition);
  output.setFilePointer(CurrentPosition);
  return Result;
}